

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconhmp.cpp
# Opt level: O0

CVmFmtTabStop * __thiscall CVmFormatter::find_tab(CVmFormatter *this,wchar_t *id,int create)

{
  CVmHashFunc *hash_function;
  undefined8 *puVar1;
  CVmFmtTabStop *pCVar2;
  CVmHashTable *in_RDI;
  int in_stack_000000f4;
  wchar_t *in_stack_000000f8;
  CVmHashTable *in_stack_00000100;
  int in_stack_ffffffffffffffbc;
  
  if (in_RDI[0x77f].hash_function_ == (CVmHashFunc *)0x0) {
    hash_function = (CVmHashFunc *)operator_new(0x20);
    puVar1 = (undefined8 *)operator_new(8);
    *puVar1 = 0;
    CVmHashFuncCS::CVmHashFuncCS((CVmHashFuncCS *)hash_function);
    CVmHashTable::CVmHashTable
              (in_RDI,(int)((ulong)puVar1 >> 0x20),hash_function,in_stack_ffffffffffffffbc);
    in_RDI[0x77f].hash_function_ = hash_function;
  }
  pCVar2 = CVmFmtTabStop::find(in_stack_00000100,in_stack_000000f8,in_stack_000000f4);
  return pCVar2;
}

Assistant:

CVmFmtTabStop *CVmFormatter::find_tab(wchar_t *id, int create)
{
    /* if we don't have a hash table yet, create one */
    if (tabs_ == 0)
        tabs_ = new CVmHashTable(64, new CVmHashFuncCS(), TRUE);

    /* find the tab */
    return CVmFmtTabStop::find(tabs_, id, create);
}